

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecules.cpp
# Opt level: O1

void __thiscall Molecules::Display(Molecules *this)

{
  ostream *poVar1;
  _Hash_node_base *p_Var2;
  string local_58;
  Molecules *local_38;
  
  p_Var2 = (this->molecules)._M_h._M_before_begin._M_nxt;
  local_38 = this;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      KeyManager::Get_abi_cxx11_(&local_58,(KeyManager *)diplo::KM,(KEY_ID)p_Var2[1]._M_nxt);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      Molecule::Display((Molecule *)(p_Var2 + 2));
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Number of molecules: ",0x15);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Molecules::Display() {

	for (unordered_map<KEY_ID, Molecule >::iterator it = molecules.begin(); it != molecules.end(); it++) {
			cout << it->first << "\t" << diplo::KM.Get(it->first )<< endl;
			it->second.Display();
	}

	cout << endl << "Number of molecules: " << molecules.size() << endl;
}